

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::idle
          (MicrothreadManager<implementations::brainfck::BFImplementation> *this)

{
  bool bVar1;
  pointer p_Var2;
  vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  cleanup_processes;
  _threads_iterator local_50;
  _Vector_base<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_50._M_node = (this->threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = local_48._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)local_50._M_node != &(this->threads)._M_t._M_impl.super__Rb_tree_header;
      local_50._M_node = (_Base_ptr)std::_Rb_tree_increment(local_50._M_node)) {
    if ((*(char *)((long)&local_50._M_node[1]._M_left + 4) == '\0') &&
       (bVar1 = Microthread<implementations::brainfck::BFImplementation>::isResolved
                          ((Microthread<implementations::brainfck::BFImplementation> *)
                           &local_50._M_node[1]._M_parent), bVar1)) {
      thread_remove_scheduling(this,local_50);
      std::
      vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
      ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
                   *)&local_48,&local_50);
    }
  }
  for (; p_Var2 != local_48._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
                        *)&this->threads,p_Var2->_M_node);
  }
  std::
  _Vector_base<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

virtual void idle() {
				std::vector<typename _threads_type::iterator> cleanup_processes;
				// Find processes to clean up
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.watched == false && it->second.isResolved()) {
						thread_remove_scheduling(it);
						cleanup_processes.push_back(it);
					}
				}
				// Clean up the processes we found
				for (auto it = cleanup_processes.begin(); it != cleanup_processes.end(); ++it) {
					threads.erase(*it);
				}
			}